

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QItemSelection * __thiscall QListViewPrivate::selection(QListViewPrivate *this,QRect *rect)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  QModelIndex *pQVar3;
  QRect *in_RSI;
  QItemSelection *in_RDI;
  long in_FS_OFFSET;
  QItemSelection *selection;
  const_iterator it;
  QList<QModelIndex> intersectVector;
  QModelIndex br;
  QModelIndex tl;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  QItemSelection *pQVar4;
  QListViewPrivate *in_stack_ffffffffffffff80;
  const_iterator local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_QList<QItemSelectionRange>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<QItemSelectionRange>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  QItemSelection::QItemSelection((QItemSelection *)0x87e1ec);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x87e226);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x87e257);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  intersectingSet(in_stack_ffffffffffffff80,in_RSI,SUB81((ulong)pQVar4 >> 0x38,0));
  local_58.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = QList<QModelIndex>::begin
                       ((QList<QModelIndex> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  while( true ) {
    o = QList<QModelIndex>::end
                  ((QList<QModelIndex> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_58,o);
    if (!bVar1) break;
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
    ;
    if ((bVar1) ||
       (bVar1 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)), bVar1)) {
      pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_58);
      in_stack_ffffffffffffff64 = QModelIndex::row(pQVar3);
      iVar2 = QModelIndex::row((QModelIndex *)&local_20);
      if (in_stack_ffffffffffffff64 == iVar2 + -1) {
        pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_58);
        local_20 = *(undefined1 **)pQVar3;
        local_18 = (undefined1 *)pQVar3->i;
        local_10.ptr = (pQVar3->m).ptr;
      }
      else {
        pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_58);
        in_stack_ffffffffffffff60 = QModelIndex::row(pQVar3);
        iVar2 = QModelIndex::row((QModelIndex *)&local_38);
        if (in_stack_ffffffffffffff60 == iVar2 + 1) {
          pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_58);
          local_38 = *(undefined1 **)pQVar3;
          local_30 = (undefined1 *)pQVar3->i;
          local_28.ptr = (pQVar3->m).ptr;
        }
        else {
          QItemSelection::select((QModelIndex *)in_RDI,(QModelIndex *)&local_20);
          pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_58);
          local_38 = *(undefined1 **)pQVar3;
          local_30 = (undefined1 *)pQVar3->i;
          local_28.ptr = (pQVar3->m).ptr;
          local_20 = local_38;
          local_18 = local_30;
          local_10.ptr = local_28.ptr;
        }
      }
    }
    else {
      pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_58);
      local_38 = *(undefined1 **)pQVar3;
      local_30 = (undefined1 *)pQVar3->i;
      local_28.ptr = (pQVar3->m).ptr;
      local_20 = local_38;
      local_18 = local_30;
      local_10.ptr = local_28.ptr;
    }
    QList<QModelIndex>::const_iterator::operator++(&local_58);
  }
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if ((bVar1) &&
     (bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)), bVar1)) {
    QItemSelection::select((QModelIndex *)in_RDI,(QModelIndex *)&local_20);
  }
  else {
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
    ;
    if (bVar1) {
      QItemSelection::select((QModelIndex *)in_RDI,(QModelIndex *)&local_20);
    }
    else {
      bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (bVar1) {
        QItemSelection::select((QModelIndex *)in_RDI,(QModelIndex *)&local_38);
      }
    }
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87e51b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelection QListViewPrivate::selection(const QRect &rect) const
{
    QItemSelection selection;
    QModelIndex tl, br;
    const QList<QModelIndex> intersectVector = intersectingSet(rect);
    QList<QModelIndex>::const_iterator it = intersectVector.begin();
    for (; it != intersectVector.end(); ++it) {
        if (!tl.isValid() && !br.isValid()) {
            tl = br = *it;
        } else if ((*it).row() == (tl.row() - 1)) {
            tl = *it; // expand current range
        } else if ((*it).row() == (br.row() + 1)) {
            br = (*it); // expand current range
        } else {
            selection.select(tl, br); // select current range
            tl = br = *it; // start new range
        }
    }

    if (tl.isValid() && br.isValid())
        selection.select(tl, br);
    else if (tl.isValid())
        selection.select(tl, tl);
    else if (br.isValid())
        selection.select(br, br);

    return selection;
}